

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fp-impl.inc.c
# Opt level: O1

void gen_helper_mffscrn(DisasContext_conflict10 *ctx,TCGv_i64 t1)

{
  TCGContext_conflict10 *s;
  TCGTemp *a1;
  TCGv_i32 pTVar1;
  uintptr_t o;
  uintptr_t o_1;
  uintptr_t o_2;
  TCGv_i64 ret;
  uintptr_t o_3;
  TCGTemp *local_48;
  TCGTemp *local_40;
  TCGTemp *local_38;
  
  s = ctx->uc->tcg_ctx;
  a1 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
  ret = (TCGv_i64)((long)a1 - (long)s);
  pTVar1 = tcg_const_i32_ppc64(s,1);
  local_48 = (TCGTemp *)(s->cpu_env + (long)s);
  tcg_gen_callN_ppc64(s,helper_reset_fpstatus,(TCGTemp *)0x0,1,&local_48);
  if (cpu_fpscr != ret) {
    tcg_gen_op2_ppc64(s,INDEX_op_mov_i64,(TCGArg)a1,(TCGArg)(cpu_fpscr + (long)s));
  }
  tcg_gen_andi_i64_ppc64(s,ret,ret,0x7000000fb);
  tcg_gen_op3_ppc64(s,INDEX_op_st_i64,(TCGArg)a1,(TCGArg)(s->cpu_env + (long)s),
                    (ulong)(ctx->opcode >> 0x11 & 0x1f0) + 0x12b28);
  tcg_gen_andi_i64_ppc64(s,ret,ret,-4);
  tcg_gen_op3_ppc64(s,INDEX_op_or_i64,(TCGArg)a1,(TCGArg)a1,(TCGArg)(t1 + (long)s));
  local_48 = (TCGTemp *)(s->cpu_env + (long)s);
  local_40 = (TCGTemp *)(ret + (long)s);
  local_38 = (TCGTemp *)(pTVar1 + (long)s);
  tcg_gen_callN_ppc64(s,helper_store_fpscr,(TCGTemp *)0x0,3,&local_48);
  tcg_temp_free_internal_ppc64(s,(TCGTemp *)(pTVar1 + (long)s));
  tcg_temp_free_internal_ppc64(s,(TCGTemp *)(ret + (long)s));
  return;
}

Assistant:

static void gen_helper_mffscrn(DisasContext *ctx, TCGv_i64 t1)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i64 t0 = tcg_temp_new_i64(tcg_ctx);
    TCGv_i32 mask = tcg_const_i32(tcg_ctx, 0x0001);

    gen_reset_fpstatus(tcg_ctx);
    tcg_gen_extu_tl_i64(tcg_ctx, t0, cpu_fpscr);
    tcg_gen_andi_i64(tcg_ctx, t0, t0, FP_DRN | FP_ENABLES | FP_RN);
    set_fpr(tcg_ctx, rD(ctx->opcode), t0);

    /* Mask FPSCR value to clear RN.  */
    tcg_gen_andi_i64(tcg_ctx, t0, t0, ~FP_RN);

    /* Merge RN into FPSCR value.  */
    tcg_gen_or_i64(tcg_ctx, t0, t0, t1);

    gen_helper_store_fpscr(tcg_ctx, tcg_ctx->cpu_env, t0, mask);

    tcg_temp_free_i32(tcg_ctx, mask);
    tcg_temp_free_i64(tcg_ctx, t0);
}